

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

TProb Cipher::calcScore0(TParameters *params,TFreqMap *freqMap,TClusters *txt,
                        TClusterToLetterMap *clMap)

{
  uint uVar1;
  pointer pdVar2;
  float fVar3;
  char cVar4;
  uint uVar5;
  uint *puVar6;
  undefined4 *puVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  TGramLen TVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  TProb TVar17;
  allocator_type local_c9;
  TFreqMap *local_c8;
  ulong local_c0;
  vector<int,_std::allocator<int>_> plain;
  array<int,_27UL> letCount;
  
  uVar8 = (ulong)((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2;
  plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0;
  local_c8 = freqMap;
  std::array<int,_27UL>::fill(&letCount,(value_type_conflict2 *)&plain);
  std::vector<int,_std::allocator<int>_>::vector(&plain,(long)(int)uVar8,&local_c9);
  lVar13 = 0;
  uVar12 = 0;
  if (0 < (int)uVar8) {
    uVar12 = uVar8 & 0xffffffff;
  }
  iVar9 = 0;
  local_c0 = uVar8;
  do {
    if (uVar12 * 4 - lVar13 == 0) {
      puVar7 = &(anonymous_namespace)::kEnglishLetterFreq;
      if (params->includeSpaces != false) {
        puVar7 = &(anonymous_namespace)::kEnglishLetterWithSpacesFreq;
      }
      fVar14 = 0.0;
      for (lVar13 = 0; lVar13 != 0x1b; lVar13 = lVar13 + 1) {
        fVar3 = (float)puVar7[lVar13] * 0.01 - (float)letCount._M_elems[lVar13] / (float)iVar9;
        fVar14 = fVar14 + fVar3 * fVar3;
      }
      fVar14 = fVar14 / 27.0;
      if (fVar14 < 0.0) {
        fVar14 = sqrtf(fVar14);
      }
      else {
        fVar14 = SQRT(fVar14);
      }
      TVar11 = local_c8->len;
      cVar4 = (char)TVar11;
      dVar15 = 0.0;
      uVar8 = 0;
      TVar17 = -1e+100;
      uVar10 = 0;
      while( true ) {
        if (TVar11 < 1) {
          pdVar2 = (local_c8->prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar15 = dVar15 + pdVar2[(int)uVar10];
          do {
            uVar8 = (ulong)(int)uVar8;
            do {
              dVar16 = dVar15;
              if ((long)(int)local_c0 <= (long)uVar8) {
                TVar17 = dVar16 / (double)(int)local_c0 - (double)(fVar14 * params->wEnglishFreq);
                goto LAB_0014638d;
              }
              uVar1 = *(uint *)(CONCAT44(plain.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         plain.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start._0_4_) + uVar8 * 4);
              uVar8 = uVar8 + 1;
              dVar15 = dVar16 + params->pNonAlphabetic;
            } while (0x19 < uVar1 - 1);
            uVar10 = (uVar10 & ~(-1 << (cVar4 * '\x05' - 5U & 0x1f))) << 5 | uVar1;
            dVar15 = dVar16 + pdVar2[(int)uVar10];
          } while( true );
        }
        if (uVar12 == uVar8) break;
        iVar9 = *(int *)(CONCAT44(plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + uVar8 * 4);
        uVar1 = iVar9 - 1;
        TVar11 = TVar11 - (uint)(uVar1 < 0x1a);
        if (0x19 < uVar1) {
          dVar15 = dVar15 + params->pNonAlphabetic;
        }
        uVar5 = iVar9 + uVar10 * 0x20;
        if (0x19 < uVar1) {
          uVar5 = uVar10;
        }
        uVar10 = uVar5;
        uVar8 = uVar8 + 1;
      }
LAB_0014638d:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&plain.super__Vector_base<int,_std::allocator<int>_>);
      return TVar17;
    }
    puVar6 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::at(clMap,(key_type_conflict *)
                                ((long)(txt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar13));
    uVar10 = *puVar6;
    *(uint *)(CONCAT44(plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       plain.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start._0_4_) + lVar13) = uVar10;
    if (uVar10 - 1 < 0x1a) {
      letCount._M_elems[uVar10] = letCount._M_elems[uVar10] + 1;
LAB_0014622f:
      iVar9 = iVar9 + 1;
    }
    else if (params->includeSpaces == true) {
      letCount._M_elems[0] = letCount._M_elems[0] + 1;
      goto LAB_0014622f;
    }
    lVar13 = lVar13 + 4;
  } while( true );
}

Assistant:

TProb calcScore0(const TParameters & params, const TFreqMap & freqMap, const TClusters & txt, const TClusterToLetterMap & clMap) {
        const int n = txt.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 27> letCount;
        letCount.fill(0);
        std::vector<TLetter> plain(n);
        for (int i = 0; i < n; ++i) {
            plain[i] = clMap.at(txt[i]);
            if (plain[i] > 0 && plain[i] <= 26) {
                ++letCount[plain[i]];
                ++nlet;
            } else if (params.includeSpaces) {
                ++letCount[0];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = params.includeSpaces ? kEnglishLetterWithSpacesFreq : kEnglishLetterFreq;
            for (int i = 0; i < 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 27.0;
        letFreqCost = sqrt(letFreqCost);
        //printf("letFreqCost = %g\n", letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        TProb res = 0.0;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            if (c > 0 && c <= 26) {
                curc <<= 5;
                curc += c;
                --k;
            } else {
                res += params.pNonAlphabetic;
            }
        }

        res += prob[curc];
        while (true) {
            curc &= mask;

            while (true) {
                if (i1 >= n) return res/n - params.wEnglishFreq*letFreqCost;
                auto c = plain[i1++];
                if (c > 0 && c <= 26) {
                    curc <<= 5;
                    curc += c;
                    break;
                } else {
                    res += params.pNonAlphabetic;
                }
            }

            res += prob[curc];
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }